

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalGenerator::GenerateCMakeBuildCommand
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *target,string *config,
          string *parallel,string *native,bool ignoreErrors)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  undefined4 extraout_var;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_a0;
  string local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar3->_M_string_length);
  cmSystemTools::ConvertToOutputPath(&local_a0,__return_storage_ptr__);
  local_60.first._M_len = local_a0._M_string_length;
  local_60.first._M_str = local_a0._M_dataplus._M_p;
  local_48 = 10;
  local_40 = " --build .";
  local_38 = 0;
  views._M_len = 2;
  views._M_array = &local_60;
  local_60.second = &local_a0;
  cmCatViews(&local_80,views);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (config->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(config->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (parallel->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(parallel->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (target->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(target->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (ignoreErrors) {
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x43])();
    if (((char *)CONCAT44(extraout_var,iVar2) != (char *)0x0) &&
       (*(char *)CONCAT44(extraout_var,iVar2) != '\0')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  if (native->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(native->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GenerateCMakeBuildCommand(
  const std::string& target, const std::string& config,
  const std::string& parallel, const std::string& native, bool ignoreErrors)
{
  std::string makeCommand = cmSystemTools::GetCMakeCommand();
  makeCommand =
    cmStrCat(cmSystemTools::ConvertToOutputPath(makeCommand), " --build .");
  if (!config.empty()) {
    makeCommand += " --config \"";
    makeCommand += config;
    makeCommand += "\"";
  }
  if (!parallel.empty()) {
    makeCommand += " --parallel \"";
    makeCommand += parallel;
    makeCommand += "\"";
  }
  if (!target.empty()) {
    makeCommand += " --target \"";
    makeCommand += target;
    makeCommand += "\"";
  }
  const char* sep = " -- ";
  if (ignoreErrors) {
    const char* iflag = this->GetBuildIgnoreErrorsFlag();
    if (iflag && *iflag) {
      makeCommand += sep;
      makeCommand += iflag;
      sep = " ";
    }
  }
  if (!native.empty()) {
    makeCommand += sep;
    makeCommand += native;
  }
  return makeCommand;
}